

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

void __thiscall TCMallocTest_HugeThreadCache_Test::TestBody(TCMallocTest_HugeThreadCache_Test *this)

{
  void *pvVar1;
  void *pvVar2;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  char **array;
  TCMallocTest_HugeThreadCache_Test *this_local;
  
  printf("==== Testing huge thread cache\n");
  pvVar1 = operator_new__(560000);
  for (local_1c = 0; local_1c < 70000; local_1c = local_1c + 1) {
    pvVar2 = operator_new__(10);
    *(void **)((long)pvVar1 + (long)local_1c * 8) = pvVar2;
  }
  for (local_20 = 0; local_20 < 70000; local_20 = local_20 + 1) {
    pvVar2 = *(void **)((long)pvVar1 + (long)local_20 * 8);
    if (pvVar2 != (void *)0x0) {
      operator_delete__(pvVar2);
    }
  }
  if (pvVar1 != (void *)0x0) {
    operator_delete__(pvVar1);
  }
  return;
}

Assistant:

TEST(TCMallocTest, HugeThreadCache) {
  printf("==== Testing huge thread cache\n");
  // More than 2^16 to cause integer overflow of 16 bit counters.
  static const int kNum = 70000;
  char** array = new char*[kNum];
  for (int i = 0; i < kNum; ++i) {
    array[i] = new char[10];
  }
  for (int i = 0; i < kNum; ++i) {
    delete[] array[i];
  }
  delete[] array;
}